

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O1

_Bool testbinaryfuse16(size_t size,size_t repeated_size)

{
  size_t __n;
  undefined1 auVar1 [16];
  _Bool _Var2;
  uint uVar3;
  uint32_t uVar4;
  uint64_t *puVar5;
  uint16_t *puVar6;
  uint64_t uVar7;
  uint uVar8;
  ulong uVar9;
  double dVar10;
  undefined1 auVar11 [16];
  int iVar13;
  undefined1 auVar12 [16];
  undefined1 auVar15 [16];
  undefined1 local_98 [20];
  undefined8 uStack_84;
  uint uStack_7c;
  uint16_t *local_78;
  size_t local_70;
  void *local_68;
  uint64_t local_60;
  ulong local_58;
  uint64_t local_50;
  ulong local_48;
  undefined8 uStack_40;
  long lVar14;
  
  printf("testing binary fuse16 with size %zu and %zu duplicates\n",size,repeated_size);
  uVar8 = (uint)size;
  local_98._8_4_ = uVar8;
  uVar9 = size & 0xffffffff;
  if (uVar8 == 0) {
    uVar3 = 4;
  }
  else {
    dVar10 = log((double)uVar9);
    dVar10 = floor(dVar10 / 1.2029723039923526 + 2.25);
    uVar3 = 1 << ((byte)(long)dVar10 & 0x1f);
  }
  local_98._12_4_ = 0x40000;
  if (uVar3 < 0x40000) {
    local_98._12_4_ = uVar3;
  }
  local_98._16_4_ = local_98._12_4_ - 1;
  dVar10 = 0.0;
  if (1 < uVar8) {
    dVar10 = log((double)uVar9);
    dVar10 = 3.4538776394910684 / dVar10 + 0.875;
    if (dVar10 <= 1.125) {
      dVar10 = 1.125;
    }
  }
  iVar13 = 0;
  if (1 < uVar8) {
    dVar10 = round(dVar10 * (double)uVar9);
    iVar13 = (int)(long)dVar10;
  }
  uVar3 = (local_98._12_4_ + iVar13) - 1;
  uVar3 = ((local_98._12_4_ + (uVar3 - uVar3 % (uint)local_98._12_4_)) - 1) / (uint)local_98._12_4_;
  uVar4 = 1;
  if (2 < uVar3) {
    uVar4 = uVar3 - 2;
  }
  uStack_84._0_4_ = uVar4;
  uStack_7c = (uVar4 + 2) * local_98._12_4_;
  uStack_84._4_4_ = uVar4 * local_98._12_4_;
  local_78 = (uint16_t *)calloc((ulong)uStack_7c,2);
  puVar5 = (uint64_t *)malloc(size * 8);
  auVar1 = _DAT_00109070;
  if (size != 0) {
    lVar14 = size - 1;
    auVar11._8_4_ = (int)lVar14;
    auVar11._0_8_ = lVar14;
    auVar11._12_4_ = (int)((ulong)lVar14 >> 0x20);
    uVar7 = 0;
    auVar11 = auVar11 ^ _DAT_00109070;
    auVar12 = _DAT_00109060;
    do {
      auVar15 = auVar12 ^ auVar1;
      if ((bool)(~(auVar15._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar15._0_4_ ||
                  auVar11._4_4_ < auVar15._4_4_) & 1)) {
        puVar5[uVar7] = uVar7;
      }
      if ((auVar15._12_4_ != auVar11._12_4_ || auVar15._8_4_ <= auVar11._8_4_) &&
          auVar15._12_4_ <= auVar11._12_4_) {
        puVar5[uVar7 + 1] = uVar7 + 1;
      }
      uVar7 = uVar7 + 2;
      lVar14 = auVar12._8_8_;
      auVar12._0_8_ = auVar12._0_8_ + 2;
      auVar12._8_8_ = lVar14 + 2;
    } while ((size + 1 & 0xfffffffffffffffe) != uVar7);
  }
  _Var2 = binary_fuse16_populate(puVar5,uVar8,(binary_fuse16_t *)local_98);
  if (_Var2) {
    local_70 = repeated_size;
    free(puVar5);
    uVar8 = uStack_7c;
    __n = (ulong)uStack_7c * 2;
    puVar5 = (uint64_t *)malloc((ulong)uStack_7c * 2 + 0x20);
    puVar6 = local_78;
    local_50 = local_98._0_8_;
    *puVar5 = local_98._0_8_;
    *(uint *)(puVar5 + 3) = uVar8;
    local_68 = (void *)((long)puVar5 + 0x1c);
    local_58 = local_98._8_8_;
    local_60 = uStack_84;
    iVar13 = local_98._12_4_;
    local_48 = local_98._8_8_;
    uStack_40 = 0;
    puVar5[1] = local_98._8_8_;
    puVar5[2] = uStack_84;
    memcpy(local_68,local_78,__n);
    free(puVar6);
    local_78 = (uint16_t *)0x0;
    local_98._8_8_ = local_58;
    local_98._0_8_ = local_50;
    uStack_84 = local_60;
    local_98._16_4_ = iVar13 + -1;
    stack0xffffffffffffff78 = CONCAT412(uVar8,stack0xffffffffffffff78);
    puVar6 = (uint16_t *)malloc(__n);
    local_78 = puVar6;
    if (puVar6 != (uint16_t *)0x0) {
      memcpy(puVar6,local_68,__n);
    }
    if ((local_48 & 0xffffffff) == size) {
      free(puVar5);
      free(puVar6);
      stack0xffffffffffffff78 = (undefined1  [16])0x0;
      local_98._0_16_ = (undefined1  [16])0x0;
      local_78 = (uint16_t *)0x0;
      _Var2 = test(size,local_70,local_98,binary_fuse16_allocate_gen,binary_fuse16_free_gen,
                   binary_fuse16_size_in_bytes_gen,binary_fuse16_serialization_bytes_gen,
                   binary_fuse16_serialize_gen,binary_fuse16_deserialize_gen,
                   binary_fuse16_populate_gen,binary_fuse16_contain_gen);
    }
    else {
      _Var2 = false;
      printf("size not (de-)serialized correctly, found %d, expected %zu.",local_48 & 0xffffffff,
             size);
      free(puVar5);
      free(local_78);
    }
  }
  else {
    _Var2 = false;
  }
  return _Var2;
}

Assistant:

bool testbinaryfuse16(size_t size, size_t repeated_size) {
  printf("testing binary fuse16 with size %zu and %zu duplicates\n", size, repeated_size);
  binary_fuse16_t filter;

  // size serialization test
  binary_fuse16_allocate((uint32_t)size, &filter);
  uint64_t *big_set = (uint64_t *)malloc(sizeof(uint64_t) * size);
  for (size_t i = 0; i < size; i++) {
    big_set[i] = i;
  }
  if (!binary_fuse16_populate(big_set, (uint32_t)size, &filter)) {
    return false;
  }
  free(big_set);

  size_t buffer_size = binary_fuse16_serialization_bytes(&filter);
  char *buffer = (char *)malloc(buffer_size);
  binary_fuse16_serialize(&filter, buffer);
  binary_fuse16_free(&filter);
  binary_fuse16_deserialize(&filter, buffer);

  if (filter.Size != size) {
    printf("size not (de-)serialized correctly, found %d, expected %zu.",
           filter.Size, size);
    free(buffer);
    binary_fuse16_free(&filter);
    return false;
  }

  free(buffer);
  binary_fuse16_free(&filter);
  // end of size serialization test

  return test(size, repeated_size, &filter,
              binary_fuse16_allocate_gen,
              binary_fuse16_free_gen,
              binary_fuse16_size_in_bytes_gen,
              binary_fuse16_serialization_bytes_gen,
              binary_fuse16_serialize_gen,
              binary_fuse16_deserialize_gen,
              binary_fuse16_populate_gen,
              binary_fuse16_contain_gen);
}